

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,char *s)

{
  size_t sVar1;
  QDataStream *pQVar2;
  qint64 len;
  
  if (s == (char *)0x0) {
    len = 0;
  }
  else {
    sVar1 = strlen(s);
    len = sVar1 + 1;
  }
  pQVar2 = writeBytes(this,s,len);
  return pQVar2;
}

Assistant:

QDataStream &QDataStream::operator<<(const char *s)
{
    // Include null terminator, unless s itself is null
    const qint64 len = s ? qint64(qstrlen(s)) + 1 : 0;
    writeBytes(s, len);
    return *this;
}